

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cubbyhole.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Cubbyhole::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cubbyhole *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  Cubbyhole *this_local;
  
  client = *(Client **)this;
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (Cubbyhole *)__return_storage_ptr__;
  getUrl(&local_48,this,path);
  HttpConsumer::post(__return_storage_ptr__,client,&local_48,local_28);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Cubbyhole::create(const Path &path, const Parameters &parameters) {
  return Vault::HttpConsumer::post(client_, getUrl(path), parameters);
}